

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

Entry * __thiscall
kj::Vector<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry>::
add<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry>
          (Vector<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry> *this,Entry *params)

{
  bool bVar1;
  Entry *pEVar2;
  Entry *params_local;
  Vector<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *this_local;
  
  bVar1 = ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>::isFull
                    ((ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *)this);
  if (bVar1) {
    Vector<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>::grow
              ((Vector<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *)this,0);
  }
  pEVar2 = fwd<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry>(params);
  pEVar2 = ArrayBuilder<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry>::
           add<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry>
                     ((ArrayBuilder<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry> *)this,
                      pEVar2);
  return pEVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }